

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall ipx::Model::LoadPrimal(Model *this)

{
  SparseMatrix *this_00;
  double dVar1;
  pointer pcVar2;
  ulong uVar3;
  Int i;
  int iVar4;
  double *pdVar5;
  ulong uVar6;
  double *pdVar7;
  byte bVar8;
  long lVar9;
  double local_20;
  
  this->num_rows_ = this->num_constr_;
  this->num_cols_ = this->num_var_;
  this->dualized_ = false;
  this_00 = &this->AI_;
  SparseMatrix::operator=(this_00,&this->A_);
  for (iVar4 = 0; iVar4 < this->num_constr_; iVar4 = iVar4 + 1) {
    SparseMatrix::push_back(this_00,iVar4,1.0);
    SparseMatrix::add_column(this_00);
  }
  std::valarray<double>::operator=(&this->b_,&this->scaled_rhs_);
  std::valarray<double>::resize(&this->c_,(long)this->num_constr_ + (long)this->num_var_,0.0);
  local_20 = 0.0;
  std::valarray<double>::operator=(&this->c_,&local_20);
  if (0 < (long)this->num_var_) {
    pdVar7 = (double *)(this->c_)._M_size;
    pdVar5 = (double *)(this->scaled_obj_)._M_size;
    if (pdVar7 != (double *)0x0) {
      pdVar7 = (this->c_)._M_data;
    }
    if (pdVar5 != (double *)0x0) {
      pdVar5 = (this->scaled_obj_)._M_data;
    }
    memmove(pdVar7,pdVar5,(long)this->num_var_ << 3);
  }
  std::valarray<double>::resize(&this->lb_,(long)this->num_cols_ + (long)this->num_rows_,0.0);
  if (0 < (long)this->num_var_) {
    pdVar7 = (double *)(this->lb_)._M_size;
    pdVar5 = (double *)(this->scaled_lbuser_)._M_size;
    if (pdVar7 != (double *)0x0) {
      pdVar7 = (this->lb_)._M_data;
    }
    if (pdVar5 != (double *)0x0) {
      pdVar5 = (this->scaled_lbuser_)._M_data;
    }
    memmove(pdVar7,pdVar5,(long)this->num_var_ << 3);
  }
  std::valarray<double>::resize(&this->ub_,(long)this->num_cols_ + (long)this->num_rows_,0.0);
  iVar4 = this->num_var_;
  if (0 < (long)iVar4) {
    pdVar7 = (double *)(this->ub_)._M_size;
    pdVar5 = (double *)(this->scaled_ubuser_)._M_size;
    if (pdVar7 != (double *)0x0) {
      pdVar7 = (this->ub_)._M_data;
    }
    if (pdVar5 != (double *)0x0) {
      pdVar5 = (this->scaled_ubuser_)._M_data;
    }
    memmove(pdVar7,pdVar5,(long)iVar4 << 3);
    iVar4 = this->num_var_;
  }
  pcVar2 = (this->constr_type_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = 0;
  uVar3 = (ulong)(uint)this->num_constr_;
  if (this->num_constr_ < 1) {
    uVar3 = uVar6;
  }
  pdVar7 = (this->ub_)._M_data;
  pdVar5 = (this->lb_)._M_data;
  for (; uVar3 != uVar6; uVar6 = uVar6 + 1) {
    bVar8 = pcVar2[uVar6] - 0x3c;
    if (bVar8 < 3) {
      lVar9 = (ulong)bVar8 * 8;
      dVar1 = *(double *)(&DAT_003b7800 + lVar9);
      pdVar5[(long)iVar4 + uVar6] = *(double *)(&DAT_003b77e8 + lVar9);
      pdVar7[(long)iVar4 + uVar6] = dVar1;
    }
  }
  return;
}

Assistant:

void Model::LoadPrimal() {
    num_rows_ = num_constr_;
    num_cols_ = num_var_;
    dualized_ = false;

    // Copy A and append identity matrix.
    AI_ = A_;
    for (Int i = 0; i < num_constr_; i++) {
        AI_.push_back(i, 1.0);
        AI_.add_column();
    }
    assert(AI_.cols() == num_var_+num_constr_);

    // Copy vectors and set bounds on slack variables.
    b_ = scaled_rhs_;
    c_.resize(num_var_+num_constr_);
    c_ = 0.0;
    std::copy_n(std::begin(scaled_obj_), num_var_, std::begin(c_));
    lb_.resize(num_rows_+num_cols_);
    std::copy_n(std::begin(scaled_lbuser_), num_var_, std::begin(lb_));
    ub_.resize(num_rows_+num_cols_);
    std::copy_n(std::begin(scaled_ubuser_), num_var_, std::begin(ub_));
    for (Int i = 0; i < num_constr_; i++) {
        switch(constr_type_[i]) {
        case '=':
            lb_[num_var_+i] = 0.0;
            ub_[num_var_+i] = 0.0;
            break;
        case '<':
            lb_[num_var_+i] = 0.0;
            ub_[num_var_+i] = INFINITY;
            break;
        case '>':
            lb_[num_var_+i] = -INFINITY;
            ub_[num_var_+i] = 0.0;
            break;
        }
    }
}